

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

type * __thiscall
duckdb::Deserializer::Read<duckdb::vector<duckdb::vector<duckdb::Value,true>,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  Value val;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  Value local_70;
  
  (__return_storage_ptr__->
  super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ).
  super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ).
  super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ).
  super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    lVar3 = 0;
    do {
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      iVar2 = (*this->_vptr_Deserializer[8])(this);
      for (lVar4 = CONCAT44(extraout_var_00,iVar2); lVar4 != 0; lVar4 = lVar4 + -1) {
        (*this->_vptr_Deserializer[6])(this);
        Value::Deserialize(&local_70,this);
        (*this->_vptr_Deserializer[7])(this);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_88,&local_70);
        Value::~Value(&local_70);
      }
      (*this->_vptr_Deserializer[9])(this);
      ::std::
      vector<duckdb::vector<duckdb::Value,true>,std::allocator<duckdb::vector<duckdb::Value,true>>>
      ::emplace_back<duckdb::vector<duckdb::Value,true>>
                ((vector<duckdb::vector<duckdb::Value,true>,std::allocator<duckdb::vector<duckdb::Value,true>>>
                  *)__return_storage_ptr__,(vector<duckdb::Value,_true> *)&local_88);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_88);
      lVar3 = lVar3 + 1;
    } while (lVar3 != CONCAT44(extraout_var,iVar1));
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}